

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultVerify.cpp
# Opt level: O3

void mult_verify::MultVerifyUint8Uint8(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  char *__end;
  bool bVar3;
  string local_50;
  
  paVar1 = &local_50.field_2;
  lVar2 = 2;
  do {
    bVar3 = (char)((ushort)((ushort)*(byte *)(lVar2 + 0x17474e) *
                           (ushort)*(byte *)(lVar2 + 0x17474f)) >> 8) != '\0';
    if ((bool)(&uint8_uint8)[lVar2] != !bVar3) {
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Error in case uint8_uint8: ","");
      err_msg<unsigned_int,unsigned_int>
                (&local_50,(uint)*(byte *)(lVar2 + 0x17474e),(uint)*(byte *)(lVar2 + 0x17474f),
                 (bool)(&uint8_uint8)[lVar2]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      bVar3 = (char)((ushort)((ushort)*(byte *)(lVar2 + 0x17474e) *
                             (ushort)*(byte *)(lVar2 + 0x17474f)) >> 8) != '\0';
    }
    if (bVar3) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    if ((&uint8_uint8)[lVar2] != '\x01') {
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Error in case uint8_uint8 throw: ","");
      err_msg<unsigned_int,unsigned_int>
                (&local_50,(uint)*(byte *)(lVar2 + 0x17474e),(uint)*(byte *)(lVar2 + 0x17474f),
                 (bool)(&uint8_uint8)[lVar2]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    lVar2 = lVar2 + 3;
  } while (lVar2 != 0x15b);
  return;
}

Assistant:

void MultVerifyUint8Uint8()
{
	size_t i;

	for( i = 0; i < COUNTOF(uint8_uint8); ++i )
	{
		std::uint8_t ret;
		if( SafeMultiply(uint8_uint8[i].x, uint8_uint8[i].y, ret) != uint8_uint8[i].fExpected )
		{
			//assert(false);
			err_msg( "Error in case uint8_uint8: ", (unsigned int)uint8_uint8[i].x, (unsigned int)uint8_uint8[i].y, uint8_uint8[i].fExpected );
		}

		// Now test throwing version
		bool fSuccess = true;
		try
		{
			SafeInt<std::uint8_t> si(uint8_uint8[i].x);
			si *= uint8_uint8[i].y;
		}
		catch(...)
		{
			fSuccess = false;
		}

		if( fSuccess != uint8_uint8[i].fExpected )
		{
			err_msg( "Error in case uint8_uint8 throw: ", (unsigned int)uint8_uint8[i].x, (unsigned int)uint8_uint8[i].y, uint8_uint8[i].fExpected );
		}
	}
}